

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void showToolTip(QHelpEvent *helpEvent,QWidget *widget,QStyleOptionComplex *opt,
                ComplexControl complexControl,SubControl subControl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  qsizetype qVar3;
  char16_t *pcVar4;
  bool bVar5;
  int iVar6;
  QStyle *pQVar7;
  QMdiSubWindow *pQVar8;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QWidget::style(widget);
  iVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x70,opt,widget,0);
  auVar2._8_8_ = local_68.ptr;
  auVar2._0_8_ = local_68.d;
  auVar1._8_8_ = local_68.ptr;
  auVar1._0_8_ = local_68.d;
  if (iVar6 != 0) goto LAB_004152a4;
  if (complexControl == CC_MdiControls) {
    if (subControl == SC_ComboBoxArrow) {
switchD_004150fc_caseD_8:
      local_48.size = 0;
      local_48.ptr = (char16_t *)0x0;
      QMdiSubWindow::tr((QString *)&local_68,"Close",(char *)0x0,-1);
      pcVar4 = local_48.ptr;
      qVar3 = local_68.size;
      local_48.d = local_68.d;
      local_68.d = (Data *)0x0;
      local_48.ptr = local_68.ptr;
      local_68.ptr = pcVar4;
      local_68.size = local_48.size;
      local_48.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      subControl = SC_ComboBoxListBoxPopup;
    }
    else {
      if (subControl != SC_ComboBoxEditField) {
        local_68._0_16_ = auVar1;
        if (subControl != SC_ComboBoxFrame) goto LAB_004152a4;
        goto switchD_004150fc_caseD_2;
      }
LAB_0041519f:
      local_48.size = 0;
      local_48.ptr = (char16_t *)0x0;
      local_48.d = (Data *)0x0;
      bVar5 = QWidget::isMaximized(widget);
      if ((bVar5) ||
         (pQVar8 = QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>(&widget->super_QObject),
         pQVar8 == (QMdiSubWindow *)0x0)) {
        s = "Restore Down";
      }
      else {
        s = "Restore";
      }
      QMdiSubWindow::tr((QString *)&local_68,s,(char *)0x0,-1);
      pcVar4 = local_48.ptr;
      qVar3 = local_68.size;
      local_48.d = local_68.d;
      local_68.d = (Data *)0x0;
      local_48.ptr = local_68.ptr;
      local_68.ptr = pcVar4;
      local_68.size = local_48.size;
      local_48.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      subControl = SC_ScrollBarFirst;
    }
  }
  else {
    local_68._0_16_ = auVar2;
    if (subControl == SC_None) goto LAB_004152a4;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    switch(subControl) {
    case SC_ComboBoxFrame:
      QMdiSubWindow::tr((QString *)&local_68,"Menu",(char *)0x0,-1);
      local_48.ptr = local_68.ptr;
      local_48.d = local_68.d;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_48.size = local_68.size;
      local_68.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      subControl = SC_ComboBoxFrame;
      break;
    case SC_ComboBoxEditField:
switchD_004150fc_caseD_2:
      local_48.size = 0;
      local_48.ptr = (char16_t *)0x0;
      QMdiSubWindow::tr((QString *)&local_68,"Minimize",(char *)0x0,-1);
      pcVar4 = local_48.ptr;
      qVar3 = local_68.size;
      local_48.d = local_68.d;
      local_68.d = (Data *)0x0;
      local_48.ptr = local_68.ptr;
      local_68.ptr = pcVar4;
      local_68.size = local_48.size;
      local_48.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      subControl = SC_ComboBoxEditField;
      break;
    case SC_ComboBoxEditField|SC_ComboBoxFrame:
    case SC_ComboBoxArrow|SC_ComboBoxFrame:
    case SC_ComboBoxArrow|SC_ComboBoxEditField:
    case SC_ComboBoxArrow|SC_ComboBoxEditField|SC_ComboBoxFrame:
      break;
    case SC_ComboBoxArrow:
      QMdiSubWindow::tr((QString *)&local_68,"Maximize",(char *)0x0,-1);
      local_48.ptr = local_68.ptr;
      local_48.d = local_68.d;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_48.size = local_68.size;
      local_68.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      subControl = SC_ComboBoxArrow;
      break;
    case SC_ComboBoxListBoxPopup:
      goto switchD_004150fc_caseD_8;
    default:
      if (subControl == SC_ScrollBarFirst) goto LAB_0041519f;
      if (subControl == SC_ScrollBarLast) {
        QMdiSubWindow::tr((QString *)&local_68,"Shade",(char *)0x0,-1);
        local_48.ptr = local_68.ptr;
        local_48.d = local_68.d;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_48.size = local_68.size;
        local_68.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        subControl = SC_ScrollBarLast;
      }
      else if (subControl == SC_ScrollBarSlider) {
        QMdiSubWindow::tr((QString *)&local_68,"Unshade",(char *)0x0,-1);
        local_48.ptr = local_68.ptr;
        local_48.d = local_68.d;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_48.size = local_68.size;
        local_68.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        subControl = SC_ScrollBarSlider;
      }
      else if (subControl == SC_ScrollBarGroove) {
        QMdiSubWindow::tr((QString *)&local_68,"Help",(char *)0x0,-1);
        local_48.ptr = local_68.ptr;
        local_48.d = local_68.d;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_48.size = local_68.size;
        local_68.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        subControl = SC_ScrollBarGroove;
      }
    }
  }
  pQVar7 = QWidget::style(widget);
  local_68._0_16_ =
       (**(code **)(*(long *)pQVar7 + 0xd8))(pQVar7,complexControl,opt,subControl,widget);
  QToolTip::showText((QPoint *)(helpEvent + 0x18),(QString *)&local_48,widget,(QRect *)&local_68,-1)
  ;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_004152a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void showToolTip(QHelpEvent *helpEvent, QWidget *widget, const QStyleOptionComplex &opt,
                        QStyle::ComplexControl complexControl, QStyle::SubControl subControl)
{
    Q_ASSERT(helpEvent);
    Q_ASSERT(helpEvent->type() == QEvent::ToolTip);
    Q_ASSERT(widget);

    if (widget->style()->styleHint(QStyle::SH_TitleBar_ShowToolTipsOnButtons, &opt, widget))
        return;

    // Convert CC_MdiControls to CC_TitleBar. Sub controls of different complex
    // controls cannot be in the same switch as they might have the same value.
    if (complexControl == QStyle::CC_MdiControls) {
        if (subControl == QStyle::SC_MdiMinButton)
            subControl = QStyle::SC_TitleBarMinButton;
        else if (subControl == QStyle::SC_MdiCloseButton)
            subControl = QStyle::SC_TitleBarCloseButton;
        else if (subControl == QStyle::SC_MdiNormalButton)
            subControl = QStyle::SC_TitleBarNormalButton;
        else
            subControl = QStyle::SC_None;
    }

    // Don't change the tooltip for the base widget itself.
    if (subControl == QStyle::SC_None)
        return;

    QString toolTip;

    switch (subControl) {
    case QStyle::SC_TitleBarMinButton:
        toolTip = QMdiSubWindow::tr("Minimize");
        break;
    case QStyle::SC_TitleBarMaxButton:
        toolTip = QMdiSubWindow::tr("Maximize");
        break;
    case QStyle::SC_TitleBarUnshadeButton:
        toolTip = QMdiSubWindow::tr("Unshade");
        break;
    case QStyle::SC_TitleBarShadeButton:
        toolTip = QMdiSubWindow::tr("Shade");
        break;
    case QStyle::SC_TitleBarNormalButton:
        if (widget->isMaximized() || !qobject_cast<QMdiSubWindow *>(widget))
            toolTip = QMdiSubWindow::tr("Restore Down");
        else
            toolTip = QMdiSubWindow::tr("Restore");
        break;
    case QStyle::SC_TitleBarCloseButton:
        toolTip = QMdiSubWindow::tr("Close");
        break;
    case QStyle::SC_TitleBarContextHelpButton:
        toolTip = QMdiSubWindow::tr("Help");
        break;
    case QStyle::SC_TitleBarSysMenu:
        toolTip = QMdiSubWindow::tr("Menu");
        break;
    default:
        break;
    }

    const QRect rect = widget->style()->subControlRect(complexControl, &opt, subControl, widget);
    QToolTip::showText(helpEvent->globalPos(), toolTip, widget, rect);
}